

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

string * __thiscall mp::SolverOption::echo_with_value_abi_cxx11_(SolverOption *this)

{
  byte bVar1;
  char *pcVar2;
  allocator<char> *in_RSI;
  string *in_RDI;
  MemoryWriter w;
  string *s;
  char *in_stack_fffffffffffffd68;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_00;
  undefined7 in_stack_fffffffffffffd90;
  BasicStringRef<char> in_stack_fffffffffffffd98;
  BasicMemoryWriter<char,_std::allocator<char>_> local_251;
  undefined1 local_11;
  
  local_11 = 0;
  (**(code **)(*(long *)in_RSI + 0x70))();
  bVar1 = (**(code **)(*(long *)in_RSI + 0x10))();
  if ((bVar1 & 1) == 0) {
    this_00 = &local_251;
    std::allocator<char>::allocator();
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
              ((BasicMemoryWriter<char,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffd90),in_RSI);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)this_00,in_stack_fffffffffffffd68);
    fmt::BasicWriter<char>::operator<<
              ((BasicWriter<char> *)CONCAT17(bVar1,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd98);
    (**(code **)(*(long *)in_RSI + 0x60))
              (in_RSI,(undefined1 *)((long)&local_251.super_BasicWriter<char>._vptr_BasicWriter + 1)
              );
    pcVar2 = fmt::BasicWriter<char>::c_str(&this_00->super_BasicWriter<char>);
    std::__cxx11::string::operator+=((string *)in_RDI,pcVar2);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this_00);
  }
  return in_RDI;
}

Assistant:

virtual std::string echo_with_value() {
    auto s = echo();
    if (!is_flag()) {
      fmt::MemoryWriter w;
      w << " = ";
      this->Write(w);
      s += w.c_str();
    }
    return s;
  }